

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDASetRootDirection(void *ida_mem,int *rootdir)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int nrt;
  int i;
  IDAMem IDA_mem;
  int local_24;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x291,"IDASetRootDirection",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x780);
    if (iVar1 == 0) {
      IDAProcessError((IDAMem)0x0,-0x16,0x29a,"IDASetRootDirection",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                      ,"Rootfinding was not initialized.");
      local_4 = -0x16;
    }
    else {
      for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
        *(undefined4 *)(*(long *)(in_RDI + 0x790) + (long)local_24 * 4) =
             *(undefined4 *)(in_RSI + (long)local_24 * 4);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int IDASetRootDirection(void* ida_mem, int* rootdir)
{
  IDAMem IDA_mem;
  int i, nrt;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  nrt = IDA_mem->ida_nrtfn;
  if (nrt == 0)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NO_ROOT);
    return (IDA_ILL_INPUT);
  }

  for (i = 0; i < nrt; i++) { IDA_mem->ida_rootdir[i] = rootdir[i]; }

  return (IDA_SUCCESS);
}